

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O0

void __thiscall CppGenerator::computeViewOrdering(CppGenerator *this)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  bool bVar4;
  size_t sVar5;
  ulong uVar6;
  size_t *psVar7;
  void *pvVar8;
  element_type *peVar9;
  size_type sVar10;
  reference ppAVar11;
  reference pvVar12;
  View *pVVar13;
  reference pvVar14;
  element_type *peVar15;
  long in_RDI;
  ulong uVar16;
  reference rVar17;
  reference rVar18;
  unsigned_long *i_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2_2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *group;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *__range1_2;
  size_t *i_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1_1;
  size_t origin;
  size_t viewID_3;
  size_t currentGroup;
  size_t prevOrigin;
  size_t *incView;
  iterator __end4;
  iterator __begin4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range4;
  bool candidate;
  size_t *destView;
  iterator __end2_1;
  iterator __begin2_1;
  value_type *__range2_1;
  size_t *destination;
  size_t viewID_2;
  size_t *viewID_1;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  size_t *nodeID;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> nodesToProcess;
  vector<unsigned_long,_std::allocator<unsigned_long>_> orderedViewList;
  dyn_bitset queuedViews;
  dyn_bitset processedViews;
  size_t incViewID_1;
  size_t *incViewID;
  size_t j;
  size_t i;
  size_t incOffset;
  Aggregate *aggregate;
  size_t aggNo;
  vector<bool,_std::allocator<bool>_> incViewBitset;
  size_t numberIncomingViews;
  TDNode *baseRelation;
  View *view;
  size_t viewID;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  viewsPerNode;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *in_stack_fffffffffffffaa8;
  TreeDecomposition *in_stack_fffffffffffffab0;
  allocator<unsigned_long> *in_stack_fffffffffffffab8;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffac0;
  size_type in_stack_fffffffffffffac8;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffad0;
  TreeDecomposition *pTVar19;
  allocator_type *in_stack_fffffffffffffad8;
  reference in_stack_fffffffffffffae0;
  iterator in_stack_fffffffffffffae8;
  size_type in_stack_fffffffffffffaf0;
  byte local_4ba;
  byte local_4a2;
  size_t local_3f0;
  size_t *local_3a0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_370;
  reference local_368;
  reference local_360;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_358;
  __normal_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  local_350;
  long local_348;
  reference local_340;
  unsigned_long *local_338;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_330;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_328;
  value_type local_318;
  value_type *local_310;
  undefined8 local_308;
  ulong local_2e8;
  ulong local_2e0;
  TreeDecomposition *local_2d8;
  value_type local_2c8;
  value_type *local_2c0;
  undefined8 local_2b8;
  ulong local_298;
  reference local_290;
  reference local_280;
  reference local_270;
  reference local_260;
  unsigned_long *local_258;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_250;
  long local_248;
  byte local_239;
  reference local_238;
  reference local_228;
  unsigned_long *local_220;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_218;
  reference local_210;
  ulong local_208;
  ulong *local_200;
  value_type local_1f8;
  reference local_1f0;
  unsigned_long *local_1e8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1e0;
  reference local_1d8;
  reference local_1d0;
  unsigned_long *local_1c8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_1b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_160 [4];
  reference local_f8;
  ulong local_e8;
  reference local_e0;
  reference local_d0;
  ulong local_c8;
  ulong local_c0;
  size_type local_b8;
  value_type local_b0;
  ulong local_a8;
  size_t local_70;
  TDNode *local_68;
  View *local_60;
  ulong local_58;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_20;
  
  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2a6618);
  sVar5 = QueryCompiler::numberOfViews((QueryCompiler *)0x2a6620);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = sVar5;
  uVar6 = SUB168(auVar2 * ZEXT816(0x18),0);
  uVar16 = uVar6 + 8;
  if (SUB168(auVar2 * ZEXT816(0x18),8) != 0 || 0xfffffffffffffff7 < uVar6) {
    uVar16 = 0xffffffffffffffff;
  }
  psVar7 = (size_t *)operator_new__(uVar16);
  *psVar7 = sVar5;
  psVar7 = psVar7 + 1;
  if (sVar5 != 0) {
    local_3a0 = psVar7;
    do {
      memset(local_3a0,0,0x18);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x2a66c5);
      local_3a0 = local_3a0 + 3;
    } while (local_3a0 != psVar7 + sVar5 * 3);
  }
  *(size_t **)(in_RDI + 0xa8) = psVar7;
  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2a6706);
  sVar5 = QueryCompiler::numberOfViews((QueryCompiler *)0x2a670e);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = sVar5;
  uVar6 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pvVar8 = operator_new__(uVar6);
  *(void **)(in_RDI + 0x118) = pvVar8;
  peVar9 = std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2a6741);
  TreeDecomposition::numberOfRelations(peVar9);
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x2a677d);
  std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::allocator
            ((allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)0x2a6792);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,&in_stack_fffffffffffffac0->m_bits
           ,(allocator_type *)in_stack_fffffffffffffab8);
  std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~allocator
            ((allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)0x2a67c6);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            (&in_stack_fffffffffffffac0->m_bits);
  local_58 = 0;
  while( true ) {
    uVar6 = local_58;
    std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2a6800);
    sVar5 = QueryCompiler::numberOfViews((QueryCompiler *)0x2a6808);
    if (sVar5 <= uVar6) break;
    std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2a683c);
    local_60 = QueryCompiler::getView
                         ((QueryCompiler *)in_stack_fffffffffffffab0,
                          (size_t)in_stack_fffffffffffffaa8);
    std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2a6877);
    local_68 = TreeDecomposition::getRelation
                         (in_stack_fffffffffffffab0,(size_t)in_stack_fffffffffffffaa8);
    if (local_60->_origin == local_60->_destination) {
      local_3f0 = local_68->_numOfNeighbors;
    }
    else {
      local_3f0 = local_68->_numOfNeighbors - 1;
    }
    local_70 = local_3f0;
    std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2a690d);
    QueryCompiler::numberOfViews((QueryCompiler *)0x2a6915);
    std::allocator<bool>::allocator((allocator<bool> *)0x2a6934);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffac0,
               (size_type)in_stack_fffffffffffffab8,(allocator_type *)in_stack_fffffffffffffab0);
    std::allocator<bool>::~allocator((allocator<bool> *)0x2a6960);
    local_a8 = 0;
    while( true ) {
      uVar6 = local_a8;
      sVar10 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::size(&local_60->_aggregates);
      if (sVar10 <= uVar6) break;
      ppAVar11 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                           (&local_60->_aggregates,local_a8);
      local_b0 = *ppAVar11;
      local_b8 = 0;
      local_c0 = 0;
      while( true ) {
        uVar6 = local_c0;
        sVar10 = std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::size
                           (&local_b0->_agg);
        if (sVar10 <= uVar6) break;
        for (local_c8 = 0; local_c8 < local_70; local_c8 = local_c8 + 1) {
          local_d0 = std::
                     vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     ::operator[](&local_b0->_incoming,local_b8);
          rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffad0,
                              in_stack_fffffffffffffac8);
          local_e0 = rVar17;
          std::_Bit_reference::operator=(&local_e0,true);
          local_b8 = local_b8 + 1;
        }
        local_c0 = local_c0 + 1;
      }
      local_a8 = local_a8 + 1;
    }
    local_e8 = 0;
    while( true ) {
      uVar6 = local_e8;
      std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x2a6bd5);
      sVar5 = QueryCompiler::numberOfViews((QueryCompiler *)0x2a6bdd);
      if (sVar5 <= uVar6) break;
      rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffad0,
                          in_stack_fffffffffffffac8);
      local_f8 = rVar17;
      bVar4 = std::_Bit_reference::operator_cast_to_bool(&local_f8);
      if (bVar4) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (&in_stack_fffffffffffffac0->m_bits,
                   (value_type_conflict2 *)in_stack_fffffffffffffab8);
      }
      local_e8 = local_e8 + 1;
    }
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::operator[](&local_20,(ulong)local_60->_origin);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&in_stack_fffffffffffffac0->m_bits,(value_type_conflict2 *)in_stack_fffffffffffffab8)
    ;
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x2a6cde);
    local_58 = local_58 + 1;
  }
  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2a6d08);
  QueryCompiler::numberOfViews((QueryCompiler *)0x2a6d10);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x2a6d2f);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
             (unsigned_long)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x2a6d5f);
  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2a6d70);
  QueryCompiler::numberOfViews((QueryCompiler *)0x2a6d78);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x2a6d97);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
             (unsigned_long)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x2a6dc7);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x2a6dd4);
  std::queue<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>::
  queue<std::deque<unsigned_long,std::allocator<unsigned_long>>,void>
            ((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             in_stack_fffffffffffffab0);
  peVar9 = std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2a6df4);
  local_1b8 = &peVar9->_leafNodes;
  local_1c0._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffaa8
                 );
  local_1c8 = (unsigned_long *)
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_fffffffffffffaa8);
  while( true ) {
    bVar4 = __gnu_cxx::operator!=
                      ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffffab0,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffffaa8);
    if (!bVar4) break;
    local_1d0 = __gnu_cxx::
                __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                ::operator*(&local_1c0);
    local_1d8 = std::
                vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ::operator[](&local_20,*local_1d0);
    local_1e0._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    in_stack_fffffffffffffaa8);
    local_1e8 = (unsigned_long *)
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_fffffffffffffaa8);
    while( true ) {
      bVar4 = __gnu_cxx::operator!=
                        ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_fffffffffffffab0,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_fffffffffffffaa8);
      if (!bVar4) break;
      local_1f0 = __gnu_cxx::
                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ::operator*(&local_1e0);
      sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          (*(long *)(in_RDI + 0xa8) + *local_1f0 * 0x18));
      if (sVar10 == 0) {
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
                  (in_stack_fffffffffffffac0,(size_type)in_stack_fffffffffffffab8,
                   SUB81((ulong)in_stack_fffffffffffffab0 >> 0x38,0));
        std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::push
                  ((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                    *)in_stack_fffffffffffffab0,(value_type *)in_stack_fffffffffffffaa8);
      }
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_1e0);
    }
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&local_1c0);
  }
  do {
    bVar4 = std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::
            empty((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                   *)0x2a7013);
    if (((bVar4 ^ 0xffU) & 1) == 0) {
      std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x2a7468);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](local_160,0);
      pVVar13 = QueryCompiler::getView
                          ((QueryCompiler *)in_stack_fffffffffffffab0,
                           (size_t)in_stack_fffffffffffffaa8);
      local_298 = (ulong)pVVar13->_origin;
      pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](local_160,0);
      local_2c8 = *pvVar14;
      local_2c0 = &local_2c8;
      local_2b8 = 1;
      std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x2a74ff);
      __l._M_len = in_stack_fffffffffffffaf0;
      __l._M_array = in_stack_fffffffffffffae8;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (in_stack_fffffffffffffae0,__l,in_stack_fffffffffffffad8);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::push_back((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   *)in_stack_fffffffffffffab0,(value_type *)in_stack_fffffffffffffaa8);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                (&in_stack_fffffffffffffac0->m_bits);
      std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x2a7551);
      lVar1 = *(long *)(in_RDI + 0x118);
      pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](local_160,0);
      *(undefined8 *)(lVar1 + *pvVar14 * 8) = 0;
      local_2d8 = (TreeDecomposition *)0x0;
      local_2e0 = 1;
      while( true ) {
        uVar6 = local_2e0;
        sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_160);
        if (sVar10 <= uVar6) break;
        peVar15 = std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2a75dd);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](local_160,local_2e0);
        pVVar13 = QueryCompiler::getView
                            ((QueryCompiler *)in_stack_fffffffffffffab0,
                             (size_t)in_stack_fffffffffffffaa8);
        local_2e8 = (ulong)pVVar13->_origin;
        if (((multifaq::cppgen::MULTI_OUTPUT & 1) == 0) || (local_298 != local_2e8)) {
          in_stack_fffffffffffffac0 =
               (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0xf0);
          pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (local_160,local_2e0);
          local_318 = *pvVar14;
          local_310 = &local_318;
          local_308 = 1;
          std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x2a777f);
          __l_00._M_len = (size_type)pVVar13;
          __l_00._M_array = (iterator)peVar15;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (in_stack_fffffffffffffae0,__l_00,in_stack_fffffffffffffad8);
          std::
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ::push_back((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       *)in_stack_fffffffffffffab0,(value_type *)in_stack_fffffffffffffaa8);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                    (&in_stack_fffffffffffffac0->m_bits);
          std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x2a77d1);
          in_stack_fffffffffffffab0 = (TreeDecomposition *)((long)&local_2d8->_root + 1);
          in_stack_fffffffffffffab8 = *(allocator<unsigned_long> **)(in_RDI + 0x118);
          local_2d8 = in_stack_fffffffffffffab0;
          pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (local_160,local_2e0);
          *(TreeDecomposition **)(in_stack_fffffffffffffab8 + *pvVar14 * 8) =
               in_stack_fffffffffffffab0;
        }
        else {
          in_stack_fffffffffffffae0 =
               std::
               vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             *)(in_RDI + 0xf0),(size_type)local_2d8);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    (local_160,local_2e0);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    (&in_stack_fffffffffffffac0->m_bits,
                     (value_type_conflict2 *)in_stack_fffffffffffffab8);
          in_stack_fffffffffffffad8 = *(allocator_type **)(in_RDI + 0x118);
          pTVar19 = local_2d8;
          pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (local_160,local_2e0);
          *(TreeDecomposition **)(in_stack_fffffffffffffad8 + *pvVar14 * 8) = pTVar19;
        }
        local_298 = local_2e8;
        local_2e0 = local_2e0 + 1;
      }
      local_328 = local_160;
      local_330._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_fffffffffffffaa8);
      local_338 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_fffffffffffffaa8);
      while( true ) {
        bVar4 = __gnu_cxx::operator!=
                          ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)in_stack_fffffffffffffab0,
                           (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)in_stack_fffffffffffffaa8);
        if (!bVar4) break;
        local_340 = __gnu_cxx::
                    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator*(&local_330);
        __gnu_cxx::
        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&local_330);
      }
      local_348 = in_RDI + 0xf0;
      local_350._M_current =
           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
           std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::begin(in_stack_fffffffffffffaa8);
      local_358 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  std::
                  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ::end(in_stack_fffffffffffffaa8);
      while( true ) {
        bVar4 = __gnu_cxx::operator!=
                          ((__normal_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                            *)in_stack_fffffffffffffab0,
                           (__normal_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                            *)in_stack_fffffffffffffaa8);
        if (!bVar4) break;
        local_368 = __gnu_cxx::
                    __normal_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                    ::operator*(&local_350);
        local_360 = local_368;
        local_370._M_current =
             (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_fffffffffffffaa8);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffaa8);
        while( true ) {
          bVar4 = __gnu_cxx::operator!=
                            ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              *)in_stack_fffffffffffffab0,
                             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              *)in_stack_fffffffffffffaa8);
          if (!bVar4) break;
          __gnu_cxx::
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator*(&local_370);
          __gnu_cxx::
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator++(&local_370);
        }
        __gnu_cxx::
        __normal_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
        ::operator++(&local_350);
      }
      std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::~queue
                ((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *
                 )0x2a7a29);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                (&in_stack_fffffffffffffac0->m_bits);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2a7a43);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2a7a50);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)in_stack_fffffffffffffac0);
      return;
    }
    pvVar12 = std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
              ::front((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                       *)0x2a703b);
    local_1f8 = *pvVar12;
    std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::pop
              ((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
               0x2a7065);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&in_stack_fffffffffffffac0->m_bits,(value_type_conflict2 *)in_stack_fffffffffffffab8)
    ;
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
              (in_stack_fffffffffffffac0,(size_type)in_stack_fffffffffffffab8,
               SUB81((ulong)in_stack_fffffffffffffab0 >> 0x38,0));
    std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2a70ab);
    pVVar13 = QueryCompiler::getView
                        ((QueryCompiler *)in_stack_fffffffffffffab0,
                         (size_t)in_stack_fffffffffffffaa8);
    local_208 = (ulong)pVVar13->_destination;
    local_200 = &local_208;
    local_210 = std::
                vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ::operator[](&local_20,local_208);
    local_218._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    in_stack_fffffffffffffaa8);
    local_220 = (unsigned_long *)
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_fffffffffffffaa8);
    while( true ) {
      bVar4 = __gnu_cxx::operator!=
                        ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_fffffffffffffab0,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_fffffffffffffaa8);
      if (!bVar4) break;
      local_228 = __gnu_cxx::
                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ::operator*(&local_218);
      rVar18 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_stack_fffffffffffffac0,(size_type)in_stack_fffffffffffffab8);
      local_238 = rVar18;
      bVar4 = boost::dynamic_bitset::reference::operator_cast_to_bool((reference *)&local_238);
      if (((bVar4 ^ 0xffU) & 1) != 0) {
        local_239 = 1;
        local_248 = *(long *)(in_RDI + 0xa8) + *local_228 * 0x18;
        local_250._M_current =
             (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_fffffffffffffaa8);
        local_258 = (unsigned_long *)
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               in_stack_fffffffffffffaa8);
        while( true ) {
          bVar4 = __gnu_cxx::operator!=
                            ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              *)in_stack_fffffffffffffab0,
                             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              *)in_stack_fffffffffffffaa8);
          if (!bVar4) break;
          local_260 = __gnu_cxx::
                      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      ::operator*(&local_250);
          rVar18 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (in_stack_fffffffffffffac0,(size_type)in_stack_fffffffffffffab8);
          local_270 = rVar18;
          bVar4 = boost::dynamic_bitset::reference::operator_cast_to_bool((reference *)&local_270);
          local_4a2 = 0;
          if (!bVar4) {
            rVar18 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                     operator[](in_stack_fffffffffffffac0,(size_type)in_stack_fffffffffffffab8);
            local_280 = rVar18;
            bVar4 = boost::dynamic_bitset::reference::operator_cast_to_bool((reference *)&local_280)
            ;
            local_4a2 = bVar4 ^ 0xff;
          }
          if ((local_4a2 & 1) != 0) {
            local_239 = 0;
            break;
          }
          __gnu_cxx::
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator++(&local_250);
        }
        local_4ba = 0;
        if ((local_239 & 1) != 0) {
          rVar18 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (in_stack_fffffffffffffac0,(size_type)in_stack_fffffffffffffab8);
          local_290 = rVar18;
          bVar4 = boost::dynamic_bitset::reference::operator_cast_to_bool((reference *)&local_290);
          local_4ba = bVar4 ^ 0xff;
        }
        if ((local_4ba & 1) != 0) {
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
                    (in_stack_fffffffffffffac0,(size_type)in_stack_fffffffffffffab8,
                     SUB81((ulong)in_stack_fffffffffffffab0 >> 0x38,0));
          std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::
          push((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
               in_stack_fffffffffffffab0,(value_type *)in_stack_fffffffffffffaa8);
        }
      }
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_218);
    }
  } while( true );
}

Assistant:

void CppGenerator::computeViewOrdering()
{
    incomingViews = new std::vector<size_t>[_qc->numberOfViews()]();
    viewToGroupMapping = new size_t[_qc->numberOfViews()];

    std::vector<std::vector<size_t>> viewsPerNode(
        _td->numberOfRelations(), std::vector<size_t>());
    
    for (size_t viewID = 0; viewID < _qc->numberOfViews(); ++viewID)
    {
        View* view = _qc->getView(viewID);
        TDNode* baseRelation = _td->getRelation(view->_origin);
        
        size_t numberIncomingViews =
            (view->_origin == view->_destination ? baseRelation->_numOfNeighbors :
             baseRelation->_numOfNeighbors - 1);
        
        std::vector<bool> incViewBitset(_qc->numberOfViews());
        for (size_t aggNo = 0; aggNo < view->_aggregates.size(); ++aggNo)
        {
            Aggregate* aggregate = view->_aggregates[aggNo];

            size_t incOffset = 0;
            // First find the all views that contribute to this Aggregate
            for (size_t i = 0; i < aggregate->_agg.size(); ++i)
            {
                for (size_t j = 0; j < numberIncomingViews; ++j)
                {
                    const size_t& incViewID = aggregate->_incoming[incOffset].first;
               
                    // Indicate that this view contributes to some aggregate
                    incViewBitset[incViewID] = 1;
                    ++incOffset;
                }
            }
        }        
        // For each incoming view, check if it contains any vars from the
        // variable order and then add it to the corresponding info
        for (size_t incViewID=0; incViewID < _qc->numberOfViews(); ++incViewID)
            if (incViewBitset[incViewID])
                incomingViews[viewID].push_back(incViewID);

        // Keep track of the views that origin from this node 
        viewsPerNode[view->_origin].push_back(viewID);
    }
    
    /* Next compute the topological order of the views */
    dyn_bitset processedViews(_qc->numberOfViews());
    dyn_bitset queuedViews(_qc->numberOfViews());
    
    // create orderedViewList -> which is empty
    std::vector<size_t> orderedViewList;
    std::queue<size_t> nodesToProcess;
    
    // Find all views that originate from leaf nodes
    for (const size_t& nodeID : _td->_leafNodes)
    {
        for (const size_t& viewID : viewsPerNode[nodeID])
        {
            if (incomingViews[viewID].size() == 0)
            {
                queuedViews.set(viewID);
                nodesToProcess.push(viewID);
            }
        }
    }
    
    while (!nodesToProcess.empty()) // there is a node in the set
    {
        size_t viewID = nodesToProcess.front();
        nodesToProcess.pop();

        orderedViewList.push_back(viewID);
        processedViews.set(viewID);

        const size_t& destination = _qc->getView(viewID)->_destination;

        // For each view that has the same destination 
        for (const size_t& destView : viewsPerNode[destination])
        {
            // check if this has not been processed (case for root nodes)
            if (!processedViews[destView])
            {
                bool candidate = true;
                for (const size_t& incView : incomingViews[destView])
                {    
                    if (!processedViews[incView] && !queuedViews[incView])
                    {
                        candidate = false;
                        break;
                    }
                }
                
                if (candidate && !queuedViews[destView])
                {
                    queuedViews.set(destView);
                    nodesToProcess.push(destView);
                }
            }
        }
    }

    /* Now generate the groups of views according to topological order*/
    size_t prevOrigin = _qc->getView(orderedViewList[0])->_origin;
    viewGroups.push_back({orderedViewList[0]});

    viewToGroupMapping[orderedViewList[0]] = 0;    
    size_t currentGroup = 0;
    for (size_t viewID = 1; viewID < orderedViewList.size(); ++viewID)
    {
        size_t origin = _qc->getView(orderedViewList[viewID])->_origin;
        if (MULTI_OUTPUT && prevOrigin == origin)
        {
            // Combine the two into one set of
            viewGroups[currentGroup].push_back(orderedViewList[viewID]);
            viewToGroupMapping[orderedViewList[viewID]] = currentGroup;
        }
        else
        {
            // Create a new group
            viewGroups.push_back({orderedViewList[viewID]});
            ++currentGroup;
            viewToGroupMapping[orderedViewList[viewID]] = currentGroup;
        }
        prevOrigin = origin;
    }

    /**************** PRINT OUT **********************/
    DINFO("Ordered View List: ");
    for (size_t& i : orderedViewList)
        DINFO(i << ", ");
    DINFO(std::endl);
    DINFO("View Groups: ");
    for (auto& group : viewGroups) {
        for (auto& i : group)
            DINFO(i << "  ");
        DINFO("|");
    }
    DINFO(std::endl);
    /**************** PRINT OUT **********************/
}